

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disconnected_transactions.cpp
# Opt level: O1

vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_> *
__thiscall
DisconnectedBlockTransactions::AddTransactionsFromBlock
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *__return_storage_ptr__,DisconnectedBlockTransactions *this,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *vtx)

{
  size_t *psVar1;
  element_type *peVar2;
  pointer pCVar3;
  pointer pCVar4;
  pointer pvVar5;
  pointer puVar6;
  pointer puVar7;
  const_iterator it_3;
  long lVar8;
  _Node *p_Var9;
  pointer pCVar10;
  ulong uVar11;
  pointer pCVar12;
  ulong uVar13;
  const_iterator it_2;
  pointer pvVar14;
  long lVar15;
  pointer psVar17;
  shared_ptr<const_CTransaction> *__args;
  ulong uVar18;
  long in_FS_OFFSET;
  double dVar19;
  undefined1 auVar20 [16];
  pair<std::__detail::_Node_iterator<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_false,_true>,_bool>
  pVar21;
  iterator it;
  _Node *local_40;
  long local_38;
  ulong uVar16;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar8 = ((long)(vtx->
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(vtx->
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 4) +
          (this->iters_by_txid)._M_h._M_element_count;
  auVar20._8_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar20._0_8_ = lVar8;
  auVar20._12_4_ = 0x45300000;
  dVar19 = ceil(((auVar20._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) /
                (double)(this->iters_by_txid)._M_h._M_rehash_policy._M_max_load_factor);
  std::
  _Hashtable<uint256,_std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_std::allocator<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::rehash(&(this->iters_by_txid)._M_h,
           (long)(dVar19 - 9.223372036854776e+18) & (long)dVar19 >> 0x3f | (long)dVar19);
  psVar17 = (vtx->
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar17 !=
      (vtx->
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar18 = 0;
    do {
      __args = psVar17 + -1;
      p_Var9 = std::__cxx11::
               list<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
               ::_M_create_node<std::shared_ptr<CTransaction_const>const&>
                         ((list<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
                           *)&this->queuedTx,__args);
      std::__detail::_List_node_base::_M_hook((_List_node_base *)p_Var9);
      psVar1 = &(this->queuedTx).
                super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      local_40 = p_Var9;
      pVar21 = std::
               _Hashtable<uint256,std::pair<uint256_const,std::_List_iterator<std::shared_ptr<CTransaction_const>>>,std::allocator<std::pair<uint256_const,std::_List_iterator<std::shared_ptr<CTransaction_const>>>>,std::__detail::_Select1st,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               ::
               _M_emplace<transaction_identifier<false>const&,std::_List_iterator<std::shared_ptr<CTransaction_const>>&>
                         ((_Hashtable<uint256,std::pair<uint256_const,std::_List_iterator<std::shared_ptr<CTransaction_const>>>,std::allocator<std::pair<uint256_const,std::_List_iterator<std::shared_ptr<CTransaction_const>>>>,std::__detail::_Select1st,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                           *)&this->iters_by_txid,
                          &(psVar17[-1].
                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->hash,&local_40);
      if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        __assert_fail("inserted",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/disconnected_transactions.cpp"
                      ,0x37,
                      "std::vector<CTransactionRef> DisconnectedBlockTransactions::AddTransactionsFromBlock(const std::vector<CTransactionRef> &)"
                     );
      }
      peVar2 = (__args->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar2 == (element_type *)0x0) {
        lVar8 = 0;
      }
      else {
        pCVar3 = (peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        pCVar10 = (peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar13 = (long)pCVar3 + (0x1f - (long)pCVar10) & 0xfffffffffffffff0;
        if (pCVar3 == pCVar10) {
          uVar13 = uVar18;
        }
        pCVar4 = (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        pCVar12 = (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar11 = (long)pCVar4 + (0x1f - (long)pCVar12) & 0xfffffffffffffff0;
        if (pCVar4 == pCVar12) {
          uVar11 = uVar18;
        }
        lVar8 = uVar11 + uVar13;
        for (; pCVar12 !=
               (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish; pCVar12 = pCVar12 + 1) {
          pvVar5 = *(pointer *)
                    ((long)&(pCVar12->scriptWitness).stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data + 0x10);
          pvVar14 = (pCVar12->scriptWitness).stack.
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar13 = (long)pvVar5 + (0x1f - (long)pvVar14) & 0xfffffffffffffff0;
          if (pvVar5 == pvVar14) {
            uVar13 = uVar18;
          }
          uVar11 = (ulong)(pCVar12->scriptSig).super_CScriptBase._union.indirect_contents.capacity;
          if ((pCVar12->scriptSig).super_CScriptBase._size < 0x1d) {
            uVar11 = uVar18;
          }
          uVar16 = uVar11 + 0x1f & 0x1fffffff0;
          if ((int)uVar11 == 0) {
            uVar16 = uVar18;
          }
          lVar15 = uVar16 + uVar13;
          for (; pvVar14 !=
                 *(pointer *)
                  ((long)&(pCVar12->scriptWitness).stack.
                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ._M_impl.super__Vector_impl_data + 8); pvVar14 = pvVar14 + 1) {
            puVar6 = (pvVar14->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
            puVar7 = (pvVar14->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            uVar13 = 0;
            if (puVar6 != puVar7) {
              uVar13 = (ulong)(puVar6 + (0x1f - (long)puVar7)) & 0xfffffffffffffff0;
            }
            lVar15 = lVar15 + uVar13;
          }
          lVar8 = lVar8 + lVar15;
        }
        for (; pCVar10 !=
               (peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_finish; pCVar10 = pCVar10 + 1) {
          uVar13 = (ulong)(pCVar10->scriptPubKey).super_CScriptBase._union.indirect_contents.
                          capacity;
          if ((pCVar10->scriptPubKey).super_CScriptBase._size < 0x1d) {
            uVar13 = uVar18;
          }
          uVar11 = 0;
          if ((int)uVar13 != 0) {
            uVar11 = uVar13 + 0x1f & 0x1fffffff0;
          }
          lVar8 = lVar8 + uVar11;
        }
        lVar8 = lVar8 + 0xc0;
      }
      this->cachedInnerUsage = this->cachedInnerUsage + lVar8;
      psVar17 = __args;
    } while (__args != (vtx->
                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
  }
  LimitMemoryUsage(__return_storage_ptr__,this);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::vector<CTransactionRef> DisconnectedBlockTransactions::AddTransactionsFromBlock(const std::vector<CTransactionRef>& vtx)
{
    iters_by_txid.reserve(iters_by_txid.size() + vtx.size());
    for (auto block_it = vtx.rbegin(); block_it != vtx.rend(); ++block_it) {
        auto it = queuedTx.insert(queuedTx.end(), *block_it);
        auto [_, inserted] = iters_by_txid.emplace((*block_it)->GetHash(), it);
        assert(inserted); // callers may never pass multiple transactions with the same txid
        cachedInnerUsage += RecursiveDynamicUsage(*block_it);
    }
    return LimitMemoryUsage();
}